

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  int iVar238;
  ulong uVar239;
  ulong uVar240;
  ulong uVar241;
  ulong uVar242;
  ulong uVar243;
  ulong uVar244;
  ulong uVar245;
  ulong uVar246;
  ulong uVar247;
  ulong uVar248;
  ulong uVar249;
  ulong uVar250;
  ulong uVar251;
  ulong uVar252;
  ulong uVar253;
  ulong uVar254;
  ulong uVar255;
  secp256k1_fe r;
  secp256k1_fe local_58;
  
  uVar242 = xd->n[0];
  uVar243 = xd->n[1];
  uVar245 = xd->n[2];
  uVar246 = xd->n[3];
  uVar240 = xn->n[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar240;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar242;
  uVar241 = xn->n[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar241;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar243;
  uVar250 = xd->n[4];
  uVar244 = xn->n[0];
  uVar251 = xn->n[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar251;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar245;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar244;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar246;
  uVar252 = xn->n[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar252;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar250;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB168(auVar5 * auVar130,0);
  auVar1 = auVar2 * auVar127 + auVar1 * auVar126 + auVar3 * auVar128 + auVar4 * auVar129 +
           auVar6 * ZEXT816(0x1000003d10);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar252;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar242;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar240;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar243;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar241;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar245;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar251;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar246;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar244;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar250;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SUB168(auVar5 * auVar130,8);
  auVar2 = auVar12 * ZEXT816(0x1000003d10000) +
           auVar7 * auVar131 +
           auVar11 * auVar135 + auVar10 * auVar134 + auVar9 * auVar133 + auVar8 * auVar132 +
           (auVar1 >> 0x34);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar244;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar242;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar252;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar243;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar240;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar245;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar241;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar246;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar251;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar250;
  auVar3 = (auVar2 >> 0x34) +
           auVar14 * auVar137 + auVar17 * auVar140 + auVar16 * auVar139 + auVar15 * auVar138;
  uVar239 = auVar3._0_8_;
  uVar248 = auVar3._8_8_;
  auVar222._8_8_ = uVar248 >> 0x34;
  auVar222._0_8_ = uVar248 * 0x1000 | uVar239 >> 0x34;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar239 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
  auVar3 = auVar13 * auVar136 + auVar18 * ZEXT816(0x1000003d1);
  uVar248 = auVar3._0_8_;
  uVar239 = auVar3._8_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar251;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar242;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar244;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar243;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar252;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar245;
  auVar221._8_8_ = uVar239 >> 0x34;
  auVar221._0_8_ = uVar239 * 0x1000 | uVar248 >> 0x34;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar240;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar246;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar241;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar250;
  auVar222 = auVar21 * auVar143 + auVar23 * auVar145 + auVar22 * auVar144 + auVar222;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar222._0_8_ & 0xfffffffffffff;
  auVar221 = auVar24 * ZEXT816(0x1000003d10) + auVar19 * auVar141 + auVar20 * auVar142 + auVar221;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar241;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar242;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar251;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar243;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar244;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar245;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar252;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar246;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar240;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar250;
  auVar3 = auVar29 * auVar150 + auVar28 * auVar149 + (auVar222 >> 0x34);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar3._0_8_;
  auVar4 = auVar30 * ZEXT816(0x1000003d10) +
           auVar25 * auVar146 + auVar26 * auVar147 + auVar27 * auVar148 + (auVar221 >> 0x34);
  auVar5 = auVar4 >> 0x34;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = auVar5._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar3._8_8_;
  auVar223._8_8_ = auVar5._8_8_;
  auVar223._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
  auVar224 = auVar31 * ZEXT816(0x1000003d10000) + auVar223 + auVar224;
  uVar249 = auVar224._0_8_;
  uVar247 = (auVar224._8_8_ << 0xc | uVar249 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
  uVar239 = uVar244 * 2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar239;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar240;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar251 * 2;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar241;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar252;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar252;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = SUB168(auVar34 * auVar153,0);
  auVar6 = auVar33 * auVar152 + auVar32 * auVar151 + auVar35 * ZEXT816(0x1000003d10);
  uVar252 = uVar252 * 2;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar252;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar244;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar251 * 2;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar240;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar241;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar241;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = SUB168(auVar34 * auVar153,8);
  auVar1 = auVar39 * ZEXT816(0x1000003d10000) +
           auVar36 * auVar154 + auVar38 * auVar156 + auVar37 * auVar155 + (auVar6 >> 0x34);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar244;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar244;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar252;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar251;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar241 * 2;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar240;
  auVar2 = auVar42 * auVar159 + auVar41 * auVar158 + (auVar1 >> 0x34);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar3 = auVar43 * ZEXT816(0x1000003d1) + auVar40 * auVar157;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar239;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar251;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar252;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar241;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar240;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar240;
  auVar5 = auVar46 * auVar162 + auVar45 * auVar161 + (auVar2 >> 0x34);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
  auVar2 = auVar44 * auVar160 + auVar47 * ZEXT816(0x1000003d10) + (auVar3 >> 0x34);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar239;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar241;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar251;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar251;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar252;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar240;
  auVar5 = auVar50 * auVar165 + (auVar5 >> 0x34);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar5._0_8_;
  auVar7 = auVar51 * ZEXT816(0x1000003d10) + auVar49 * auVar164 + auVar48 * auVar163 +
           (auVar2 >> 0x34);
  auVar8 = auVar7 >> 0x34;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = auVar8._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = auVar5._8_8_;
  auVar225._8_8_ = auVar8._8_8_;
  auVar225._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar226 = auVar52 * ZEXT816(0x1000003d10000) + auVar225 + auVar226;
  uVar239 = auVar226._0_8_;
  uVar248 = uVar248 & 0xfffffffffffff;
  uVar240 = uVar239 & 0xfffffffffffff;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar240;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar248;
  uVar251 = (auVar226._8_8_ << 0xc | uVar239 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
  uVar255 = auVar221._0_8_ & 0xfffffffffffff;
  uVar253 = auVar7._0_8_ & 0xfffffffffffff;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar253;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar255;
  uVar252 = auVar4._0_8_ & 0xfffffffffffff;
  uVar254 = auVar2._0_8_ & 0xfffffffffffff;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar252;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar254;
  uVar249 = uVar249 & 0xfffffffffffff;
  uVar239 = auVar3._0_8_ & 0xfffffffffffff;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar249;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar239;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar251;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar247;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = SUB168(auVar57 * auVar170,0);
  auVar1 = auVar58 * ZEXT816(0x1000003d10) +
           auVar56 * auVar169 + auVar53 * auVar166 + auVar55 * auVar168 + auVar54 * auVar167;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar248;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar251;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar240;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar255;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar253;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar252;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar249;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar254;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar239;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar247;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = SUB168(auVar57 * auVar170,8);
  auVar2 = auVar64 * ZEXT816(0x1000003d10000) +
           auVar59 * auVar171 +
           auVar63 * auVar175 + auVar62 * auVar174 + auVar61 * auVar173 + auVar60 * auVar172 +
           (auVar1 >> 0x34);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar239;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar248;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar255;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar251;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar240;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar252;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar249;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar253;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar254;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar247;
  auVar3 = auVar69 * auVar180 + auVar68 * auVar179 + auVar67 * auVar178 + auVar66 * auVar177 +
           (auVar2 >> 0x34);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
  auVar4 = auVar65 * auVar176 + auVar70 * ZEXT816(0x1000003d1);
  uVar241 = auVar4._0_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = auVar4._8_8_ * 0x1000 | uVar241 >> 0x34;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar254;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar248;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar255;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar239;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar252;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar251;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar240;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar249;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar253;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar247;
  auVar3 = auVar73 * auVar183 + auVar75 * auVar185 + auVar74 * auVar184 + (auVar3 >> 0x34);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
  auVar227 = auVar76 * ZEXT816(0x1000003d10) + auVar71 * auVar181 + auVar72 * auVar182 + auVar227;
  uVar244 = auVar227._0_8_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = auVar227._8_8_ << 0xc | uVar244 >> 0x34;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar253;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar248;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar254;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar255;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar252;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar239;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar249;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar251;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar240;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar247;
  auVar3 = auVar81 * auVar190 + auVar80 * auVar189 + (auVar3 >> 0x34);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = auVar3._0_8_;
  auVar228 = auVar82 * ZEXT816(0x1000003d10) +
             auVar79 * auVar188 + auVar78 * auVar187 + auVar77 * auVar186 + auVar228;
  auVar4 = auVar228 >> 0x34;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = auVar4._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auVar3._8_8_;
  auVar229._8_8_ = auVar4._8_8_;
  auVar229._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
  auVar230 = auVar83 * ZEXT816(0x1000003d10000) + auVar229 + auVar230;
  uVar240 = auVar230._0_8_;
  uVar239 = uVar242 * 2;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar246;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar239;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar245;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar243 * 2;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar250;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar250;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = SUB168(auVar86 * auVar193,0);
  auVar5 = auVar85 * auVar192 + auVar84 * auVar191 + auVar87 * ZEXT816(0x1000003d10);
  uVar250 = uVar250 * 2;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar250;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar242;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar246;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar243 * 2;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar245;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar245;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = SUB168(auVar86 * auVar193,8);
  auVar1 = auVar91 * ZEXT816(0x1000003d10000) +
           auVar88 * auVar194 + auVar90 * auVar196 + auVar89 * auVar195 + (auVar5 >> 0x34);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar242;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar242;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar250;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar243;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar246;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar245 * 2;
  auVar3 = auVar94 * auVar199 + auVar93 * auVar198 + (auVar1 >> 0x34);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar4 = auVar95 * ZEXT816(0x1000003d1) + auVar92 * auVar197;
  uVar242 = auVar4._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar243;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar239;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar250;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar245;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar246;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar246;
  auVar3 = auVar98 * auVar202 + auVar97 * auVar201 + (auVar3 >> 0x34);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
  auVar4 = auVar99 * ZEXT816(0x1000003d10) + auVar96 * auVar200 + (auVar4 >> 0x34);
  uVar252 = auVar4._0_8_;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar245;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar239;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar243;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar243;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar250;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar246;
  auVar3 = auVar102 * auVar205 + (auVar3 >> 0x34);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar3._0_8_;
  auVar4 = auVar103 * ZEXT816(0x1000003d10) + auVar101 * auVar204 + auVar100 * auVar203 +
           (auVar4 >> 0x34);
  uVar251 = auVar4._0_8_;
  auVar4 = auVar4 >> 0x34;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = auVar4._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar3._8_8_;
  auVar231._8_8_ = auVar4._8_8_;
  auVar231._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
  auVar232 = auVar104 * ZEXT816(0x1000003d10000) + auVar231 + auVar232;
  uVar239 = auVar232._0_8_;
  uVar245 = uVar242 * 2 & 0x1ffffffffffffe;
  uVar250 = uVar239 & 0xfffffffffffff;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar250;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar245;
  uVar239 = (auVar232._8_8_ << 0xc | uVar239 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
  uVar246 = uVar252 * 2 & 0x1ffffffffffffe;
  uVar248 = uVar251 & 0xfffffffffffff;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar248;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar246;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar239;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar239;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = SUB168(auVar107 * auVar208,0);
  auVar1 = auVar106 * auVar207 + auVar105 * auVar206 + auVar108 * ZEXT816(0x1000003d10);
  uVar243 = auVar1._0_8_;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = auVar1._8_8_ << 0xc | uVar243 >> 0x34;
  uVar239 = uVar239 * 2;
  uVar242 = uVar242 & 0xfffffffffffff;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar242;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar239;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar250;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar246;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar248;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar248;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = SUB168(auVar107 * auVar208,8);
  auVar233 = auVar112 * ZEXT816(0x1000003d10000) +
             auVar109 * auVar209 + auVar111 * auVar211 + auVar110 * auVar210 + auVar233;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar242;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar242;
  uVar252 = uVar252 & 0xfffffffffffff;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar252;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar239;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar250;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar251 * 2 & 0x1ffffffffffffe;
  auVar1 = auVar115 * auVar214 + auVar114 * auVar213 + (auVar233 >> 0x34);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = (auVar1._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar233._6_2_ & 0xf);
  auVar3 = auVar116 * ZEXT816(0x1000003d1) + auVar113 * auVar212;
  uVar246 = auVar3._0_8_;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = auVar3._8_8_ << 0xc | uVar246 >> 0x34;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar252;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar245;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar248;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar239;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar250;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar250;
  auVar1 = auVar119 * auVar217 + auVar118 * auVar216 + (auVar1 >> 0x34);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
  auVar237 = auVar117 * auVar215 + auVar120 * ZEXT816(0x1000003d10) + auVar237;
  uVar251 = auVar237._0_8_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = auVar237._8_8_ * 0x1000 | uVar251 >> 0x34;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar248;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar245;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar252;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar252;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar250;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar239;
  auVar1 = auVar123 * auVar220 + (auVar1 >> 0x34);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = auVar1._0_8_;
  auVar234 = auVar124 * ZEXT816(0x1000003d10) + auVar122 * auVar219 + auVar121 * auVar218 + auVar234
  ;
  uVar239 = auVar234._0_8_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar243 & 0xffffffffffffe;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = auVar234._8_8_ << 0xc | uVar239 >> 0x34;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = auVar1._8_8_;
  auVar236 = auVar125 * ZEXT816(0x1000003d10000) + auVar235 + auVar236;
  uVar242 = auVar236._0_8_;
  local_58.n[0] = (uVar246 & 0xfffffffffffff) * 7 + (uVar241 & 0xfffffffffffff);
  local_58.n[1] = (uVar251 & 0xfffffffffffff) * 7 + (uVar244 & 0xfffffffffffff);
  local_58.n[2] = (uVar239 & 0xfffffffffffff) * 7 + (auVar228._0_8_ & 0xfffffffffffff);
  local_58.n[3] = (uVar242 & 0xfffffffffffff) * 7 + (uVar240 & 0xfffffffffffff);
  local_58.n[4] =
       ((auVar236._8_8_ << 0xc | uVar242 >> 0x34) + (auVar233._0_8_ & 0xffffffffffff)) * 7 +
       (auVar230._8_8_ << 0xc | uVar240 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
  iVar238 = secp256k1_fe_impl_is_square_var(&local_58);
  return iVar238;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}